

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadMetaDataItem(ColladaParser *this,StringMetaData *metadata)

{
  int iVar1;
  ai_uint32 aVar2;
  undefined4 extraout_var;
  size_t sVar3;
  char *pcVar4;
  string key_str;
  string camel_key_str;
  aiString aistr;
  char *local_478;
  long local_470;
  char local_468 [16];
  string local_458;
  aiString local_434;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar4 != (char *)0x0) {
    local_478 = local_468;
    sVar3 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,pcVar4,pcVar4 + sVar3);
    pcVar4 = TestTextContent(this);
    if (pcVar4 != (char *)0x0) {
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,local_478,local_478 + local_470);
      ToCamelCase(&local_458);
      local_434.length = 0;
      local_434.data[0] = '\0';
      memset(local_434.data + 1,0x1b,0x3ff);
      sVar3 = strlen(pcVar4);
      aVar2 = (ai_uint32)sVar3;
      if ((int)aVar2 < 0x400) {
        local_434.length = aVar2;
        memcpy(local_434.data,pcVar4,(long)(int)aVar2);
        local_434.data[(int)aVar2] = '\0';
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
      ::_M_emplace_unique<std::__cxx11::string&,aiString&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  *)metadata,&local_458,&local_434);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
    }
    TestClosing(this,local_478);
    if (local_478 != local_468) {
      operator_delete(local_478);
    }
    return;
  }
  SkipElement(this);
  return;
}

Assistant:

void ColladaParser::ReadMetaDataItem(StringMetaData &metadata)
{
    // Metadata such as created, keywords, subject etc
    const char* key_char = mReader->getNodeName();
    if (key_char != nullptr)
    {
        const std::string key_str(key_char);
        const char* value_char = TestTextContent();
        if (value_char != nullptr)
        {
            std::string camel_key_str = key_str;
            ToCamelCase(camel_key_str);
            aiString aistr;
            aistr.Set(value_char);
            metadata.emplace(camel_key_str, aistr);
        }
        TestClosing(key_str.c_str());
    }
    else
        SkipElement();
}